

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqfuncproto.h
# Opt level: O1

void __thiscall SQFunctionProto::Release(SQFunctionProto *this)

{
  SQOuterVar *pSVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  
  if (0 < this->_nliterals) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      SQObjectPtr::~SQObjectPtr
                ((SQObjectPtr *)((long)&(this->_literals->super_SQObject)._type + lVar7));
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 < this->_nliterals);
  }
  if (0 < this->_nparameters) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      SQObjectPtr::~SQObjectPtr
                ((SQObjectPtr *)((long)&(this->_parameters->super_SQObject)._type + lVar7));
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 < this->_nparameters);
  }
  if (0 < this->_nfunctions) {
    lVar7 = 0;
    lVar8 = 0;
    do {
      SQObjectPtr::~SQObjectPtr
                ((SQObjectPtr *)((long)&(this->_functions->super_SQObject)._type + lVar7));
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x10;
    } while (lVar8 < this->_nfunctions);
  }
  if (0 < this->_noutervalues) {
    lVar7 = 0x18;
    lVar8 = 0;
    do {
      pSVar1 = this->_outervalues;
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)&pSVar1->_type + lVar7));
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)((long)pSVar1 + lVar7 + -0x10));
      lVar8 = lVar8 + 1;
      lVar7 = lVar7 + 0x28;
    } while (lVar8 < this->_noutervalues);
  }
  lVar7 = this->_nlocalvarinfos;
  if (0 < lVar7) {
    lVar8 = 0;
    lVar9 = 0;
    do {
      SQObjectPtr::~SQObjectPtr
                ((SQObjectPtr *)((long)&(this->_localvarinfos->_name).super_SQObject._type + lVar8))
      ;
      lVar9 = lVar9 + 1;
      lVar7 = this->_nlocalvarinfos;
      lVar8 = lVar8 + 0x28;
    } while (lVar9 < lVar7);
  }
  lVar8 = this->_nparameters;
  lVar9 = this->_nliterals;
  lVar2 = this->_nfunctions;
  lVar3 = this->_ndefaultparams;
  lVar4 = this->_nlineinfos;
  lVar5 = this->_ninstructions;
  lVar6 = this->_noutervalues;
  (**(this->super_SQCollectable).super_SQRefCounted._vptr_SQRefCounted)(this);
  sq_vm_free(this,(lVar8 + lVar9 + lVar2 + lVar4) * 0x10 +
                  (lVar3 + lVar5) * 8 + (lVar7 + lVar6) * 0x28 + 0xe0);
  return;
}

Assistant:

void Release(){
        _DESTRUCT_VECTOR(SQObjectPtr,_nliterals,_literals);
        _DESTRUCT_VECTOR(SQObjectPtr,_nparameters,_parameters);
        _DESTRUCT_VECTOR(SQObjectPtr,_nfunctions,_functions);
        _DESTRUCT_VECTOR(SQOuterVar,_noutervalues,_outervalues);
        //_DESTRUCT_VECTOR(SQLineInfo,_nlineinfos,_lineinfos); //not required are 2 integers
        _DESTRUCT_VECTOR(SQLocalVarInfo,_nlocalvarinfos,_localvarinfos);
        SQInteger size = _FUNC_SIZE(_ninstructions,_nliterals,_nparameters,_nfunctions,_noutervalues,_nlineinfos,_nlocalvarinfos,_ndefaultparams);
        this->~SQFunctionProto();
        sq_vm_free(this,size);
    }